

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O1

void __thiscall icu_63::Locale::~Locale(Locale *this)

{
  void *in_RSI;
  
  ~Locale(this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

Locale::~Locale()
{
    if (baseName != fullName) {
        uprv_free(baseName);
    }
    baseName = NULL;
    /*if fullName is on the heap, we free it*/
    if (fullName != fullNameBuffer)
    {
        uprv_free(fullName);
        fullName = NULL;
    }
}